

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_model.pb.cc
# Opt level: O1

bool __thiscall sentencepiece::ModelProto::IsInitialized(ModelProto *this)

{
  uint uVar1;
  bool bVar2;
  LogMessage *pLVar3;
  LogFinisher local_51;
  LogMessage local_50;
  
  bVar2 = google::protobuf::internal::ExtensionSet::IsInitialized(&this->_extensions_);
  if ((bVar2) &&
     (bVar2 = google::protobuf::internal::AllAreInitialized<sentencepiece::ModelProto_SentencePiece>
                        (&this->pieces_), bVar2)) {
    uVar1 = (this->_has_bits_).has_bits_[0];
    if (((uVar1 & 1) != 0) && (this->trainer_spec_ == (TrainerSpec *)0x0)) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_50,LOGLEVEL_DFATAL,"src/builtin_pb/sentencepiece_model.pb.h",0x1241);
      pLVar3 = google::protobuf::internal::LogMessage::operator<<
                         (&local_50,"CHECK failed: !value || trainer_spec_ != nullptr: ");
      google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar3);
      google::protobuf::internal::LogMessage::~LogMessage(&local_50);
    }
    if (((uVar1 & 1) == 0) ||
       (bVar2 = google::protobuf::internal::ExtensionSet::IsInitialized
                          (&this->trainer_spec_->_extensions_), bVar2)) {
      uVar1 = (this->_has_bits_).has_bits_[0];
      if (((uVar1 & 2) != 0) && (this->normalizer_spec_ == (NormalizerSpec *)0x0)) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_50,LOGLEVEL_DFATAL,"src/builtin_pb/sentencepiece_model.pb.h",0x1294);
        pLVar3 = google::protobuf::internal::LogMessage::operator<<
                           (&local_50,"CHECK failed: !value || normalizer_spec_ != nullptr: ");
        google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar3);
        google::protobuf::internal::LogMessage::~LogMessage(&local_50);
      }
      if (((uVar1 & 2) == 0) ||
         (bVar2 = google::protobuf::internal::ExtensionSet::IsInitialized
                            (&this->normalizer_spec_->_extensions_), bVar2)) {
        uVar1 = (this->_has_bits_).has_bits_[0];
        if (((uVar1 & 4) != 0) && (this->self_test_data_ == (SelfTestData *)0x0)) {
          google::protobuf::internal::LogMessage::LogMessage
                    (&local_50,LOGLEVEL_DFATAL,"src/builtin_pb/sentencepiece_model.pb.h",0x12e7);
          pLVar3 = google::protobuf::internal::LogMessage::operator<<
                             (&local_50,"CHECK failed: !value || self_test_data_ != nullptr: ");
          google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar3);
          google::protobuf::internal::LogMessage::~LogMessage(&local_50);
        }
        if (((uVar1 & 4) == 0) ||
           (bVar2 = google::protobuf::internal::ExtensionSet::IsInitialized
                              (&this->self_test_data_->_extensions_), bVar2)) {
          uVar1 = (this->_has_bits_).has_bits_[0];
          if (((uVar1 & 8) != 0) && (this->denormalizer_spec_ == (NormalizerSpec *)0x0)) {
            google::protobuf::internal::LogMessage::LogMessage
                      (&local_50,LOGLEVEL_DFATAL,"src/builtin_pb/sentencepiece_model.pb.h",0x133a);
            pLVar3 = google::protobuf::internal::LogMessage::operator<<
                               (&local_50,"CHECK failed: !value || denormalizer_spec_ != nullptr: ")
            ;
            google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar3);
            google::protobuf::internal::LogMessage::~LogMessage(&local_50);
          }
          if (((uVar1 & 8) == 0) ||
             (bVar2 = google::protobuf::internal::ExtensionSet::IsInitialized
                                (&this->denormalizer_spec_->_extensions_), bVar2)) {
            return true;
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool ModelProto::IsInitialized() const {
  if (!_extensions_.IsInitialized()) {
    return false;
  }

  if (!::PROTOBUF_NAMESPACE_ID::internal::AllAreInitialized(pieces_)) return false;
  if (_internal_has_trainer_spec()) {
    if (!trainer_spec_->IsInitialized()) return false;
  }
  if (_internal_has_normalizer_spec()) {
    if (!normalizer_spec_->IsInitialized()) return false;
  }
  if (_internal_has_self_test_data()) {
    if (!self_test_data_->IsInitialized()) return false;
  }
  if (_internal_has_denormalizer_spec()) {
    if (!denormalizer_spec_->IsInitialized()) return false;
  }
  return true;
}